

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

optional<slang::ConstantRange> __thiscall
slang::ast::RangeSelectExpression::evalRange
          (RangeSelectExpression *this,EvalContext *context,ConstantValue *val,bool enforceBounds)

{
  SourceRange sourceRange;
  ConstantRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  SourceRange range_03;
  SourceRange range_04;
  SourceRange range_05;
  SourceRange range_06;
  bool bVar1;
  int32_t iVar2;
  Expression *pEVar3;
  int *piVar4;
  ConstantRange *pCVar5;
  Diagnostic *pDVar6;
  Diagnostic *arg;
  byte in_CL;
  ConstantValue *in_RDX;
  undefined8 extraout_RDX;
  EvalContext *in_RSI;
  RangeSelectExpression *in_RDI;
  optional<slang::ConstantRange> oVar7;
  Diagnostic *diag_2;
  Diagnostic *diag_1;
  size_t size;
  int32_t width;
  Diagnostic *diag;
  ConstantRange valueRange;
  optional<slang::ConstantRange> range;
  bool isLittleEndian;
  ConstantRange result;
  optional<int> ri;
  optional<int> li;
  Type *valueType;
  ConstantValue cr;
  ConstantValue cl;
  ConstantValue *prevQ;
  Type *in_stack_fffffffffffffc18;
  EvalContext *in_stack_fffffffffffffc20;
  Type *in_stack_fffffffffffffc28;
  int arg_00;
  EvalContext *in_stack_fffffffffffffc30;
  SourceLocation in_stack_fffffffffffffc38;
  SourceLocation in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc4c;
  undefined2 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc52;
  undefined1 in_stack_fffffffffffffc53;
  int32_t in_stack_fffffffffffffc54;
  int32_t in_stack_fffffffffffffc58;
  EvalContext *in_stack_fffffffffffffc68;
  Diagnostic *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffc7c;
  DiagCode in_stack_fffffffffffffc84;
  int local_220 [2];
  SourceLocation local_218;
  SourceLocation SStack_210;
  undefined4 local_204;
  Diagnostic *local_200;
  int local_1f8 [3];
  int local_1ec;
  SourceLocation local_1e8;
  SourceLocation SStack_1e0;
  undefined4 local_1cc;
  Diagnostic *local_1c8;
  Diagnostic *local_1c0;
  bitwidth_t local_1b4;
  ConstantRange local_1b0;
  int32_t local_1a8;
  int32_t local_1a4;
  int32_t local_1a0;
  int32_t local_19c;
  SourceLocation local_198;
  SourceLocation SStack_190;
  undefined4 local_184;
  Diagnostic *local_180;
  ConstantRange local_174;
  SourceLocation local_168;
  SourceLocation SStack_160;
  undefined4 local_154;
  _Storage<slang::ConstantRange,_true> local_150;
  undefined4 local_148;
  _Storage<slang::ConstantRange,_true> local_140;
  undefined4 local_138;
  ConstantRange local_134;
  undefined1 local_12a;
  SourceLocation local_128;
  SourceLocation SStack_120;
  ConstantRange local_118;
  ConstantRange local_110;
  ConstantRange local_108 [2];
  SourceLocation local_f8;
  SourceLocation SStack_f0;
  undefined4 local_e0;
  SourceLocation local_d8;
  SourceLocation SStack_d0;
  undefined4 local_bc;
  _Optional_payload_base<int> local_b8;
  _Optional_payload_base<int> local_b0;
  Type *local_a8;
  undefined4 local_9c;
  ConstantValue *local_38;
  byte local_29;
  ConstantValue *local_28;
  EvalContext *local_20;
  _Storage<slang::ConstantRange,_true> local_c;
  undefined1 local_4;
  
  local_29 = in_CL & 1;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_38 = EvalContext::getQueueTarget(in_RSI);
  bVar1 = slang::ConstantValue::isQueue((ConstantValue *)0xa37a3c);
  if (bVar1) {
    EvalContext::setQueueTarget(local_20,local_28);
  }
  left(in_RDI);
  Expression::eval((Expression *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  right(in_RDI);
  Expression::eval((Expression *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  EvalContext::setQueueTarget(local_20,local_38);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa37ad6);
  if ((bVar1) &&
     (bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa37af9), bVar1)) {
    value(in_RDI);
    local_a8 = not_null<const_slang::ast::Type_*>::operator*
                         ((not_null<const_slang::ast::Type_*> *)0xa37b93);
    slang::ConstantValue::integer((ConstantValue *)0xa37bba);
    local_b0 = (_Optional_payload_base<int>)SVInt::as<int>((SVInt *)in_stack_fffffffffffffc38);
    slang::ConstantValue::integer((ConstantValue *)0xa37bf8);
    local_b8 = (_Optional_payload_base<int>)SVInt::as<int>((SVInt *)in_stack_fffffffffffffc38);
    bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0xa37c36);
    if (bVar1) {
      bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0xa37d12);
      if (bVar1) {
        ConstantRange::ConstantRange(local_108);
        if (in_RDI->selectionKind == Simple) {
          piVar4 = std::optional<int>::operator*((optional<int> *)0xa37e0d);
          iVar2 = *piVar4;
          piVar4 = std::optional<int>::operator*((optional<int> *)0xa37e23);
          ConstantRange::ConstantRange(&local_110,iVar2,*piVar4);
          local_108[0] = local_110;
          local_118 = local_110;
          local_128 = (in_RDI->super_Expression).sourceRange.startLoc;
          SStack_120 = (in_RDI->super_Expression).sourceRange.endLoc;
          range_00.right._0_2_ = in_stack_fffffffffffffc50;
          range_00.left = in_stack_fffffffffffffc4c;
          range_00.right._2_1_ = in_stack_fffffffffffffc52;
          range_00.right._3_1_ = in_stack_fffffffffffffc53;
          sourceRange.endLoc = in_stack_fffffffffffffc40;
          sourceRange.startLoc = in_stack_fffffffffffffc38;
          bVar1 = checkRangeOverflow<slang::ast::EvalContext>
                            (range_00,in_stack_fffffffffffffc30,sourceRange);
          if (bVar1) {
            std::optional<slang::ConstantRange>::optional
                      ((optional<slang::ConstantRange> *)&local_c);
            goto LAB_00a3881e;
          }
        }
        else {
          local_12a = 0;
          bVar1 = Type::hasFixedRange((Type *)in_stack_fffffffffffffc20);
          if (bVar1) {
            local_134 = Type::getFixedRange(in_stack_fffffffffffffc18);
            local_12a = ConstantRange::isLittleEndian(&local_134);
          }
          std::optional<int>::operator*((optional<int> *)0xa37f51);
          std::optional<int>::operator*((optional<int> *)0xa37f67);
          oVar7 = ConstantRange::getIndexedRange
                            (in_stack_fffffffffffffc58,in_stack_fffffffffffffc54,
                             (bool)in_stack_fffffffffffffc53,(bool)in_stack_fffffffffffffc52);
          local_150 = oVar7.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                      super__Optional_payload_base<slang::ConstantRange>._M_payload;
          local_148 = CONCAT31(local_148._1_3_,
                               oVar7.super__Optional_base<slang::ConstantRange,_true,_true>.
                               _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                               _M_engaged);
          local_138 = local_148;
          local_140 = local_150;
          bVar1 = std::optional::operator_cast_to_bool((optional<slang::ConstantRange> *)0xa37ff1);
          if (!bVar1) {
            local_154 = 0x8b0007;
            local_168 = (in_RDI->super_Expression).sourceRange.startLoc;
            SStack_160 = (in_RDI->super_Expression).sourceRange.endLoc;
            range_03.endLoc._0_4_ = in_stack_fffffffffffffc78;
            range_03.startLoc = (SourceLocation)in_stack_fffffffffffffc70;
            range_03.endLoc._4_4_ = in_stack_fffffffffffffc7c;
            EvalContext::addDiag(in_stack_fffffffffffffc68,in_stack_fffffffffffffc84,range_03);
            std::optional<slang::ConstantRange>::optional
                      ((optional<slang::ConstantRange> *)&local_c);
            goto LAB_00a3881e;
          }
          pCVar5 = std::optional<slang::ConstantRange>::operator*
                             ((optional<slang::ConstantRange> *)0xa38064);
          local_108[0] = *pCVar5;
        }
        bVar1 = Type::hasFixedRange((Type *)in_stack_fffffffffffffc20);
        if (bVar1) {
          local_174 = Type::getFixedRange(in_stack_fffffffffffffc18);
          if (((in_RDI->warnedAboutRange & 1U) == 0) &&
             ((bVar1 = ConstantRange::containsPoint
                                 ((ConstantRange *)in_stack_fffffffffffffc30,
                                  (int32_t)((ulong)in_stack_fffffffffffffc28 >> 0x20)), !bVar1 ||
              (bVar1 = ConstantRange::containsPoint
                                 ((ConstantRange *)in_stack_fffffffffffffc30,
                                  (int32_t)((ulong)in_stack_fffffffffffffc28 >> 0x20)), !bVar1)))) {
            local_184 = 0xd00007;
            local_198 = (in_RDI->super_Expression).sourceRange.startLoc;
            SStack_190 = (in_RDI->super_Expression).sourceRange.endLoc;
            range_04.endLoc._0_4_ = in_stack_fffffffffffffc78;
            range_04.startLoc = (SourceLocation)in_stack_fffffffffffffc70;
            range_04.endLoc._4_4_ = in_stack_fffffffffffffc7c;
            local_180 = EvalContext::addDiag
                                  (in_stack_fffffffffffffc68,in_stack_fffffffffffffc84,range_04);
            Diagnostic::operator<<<int>
                      ((Diagnostic *)in_stack_fffffffffffffc30,
                       (int)((ulong)in_stack_fffffffffffffc28 >> 0x20));
            Diagnostic::operator<<<int>
                      ((Diagnostic *)in_stack_fffffffffffffc30,
                       (int)((ulong)in_stack_fffffffffffffc28 >> 0x20));
            ast::operator<<(in_stack_fffffffffffffc70,(Type *)in_stack_fffffffffffffc68);
          }
          if ((local_29 & 1) != 0) {
            local_19c = ConstantRange::lower((ConstantRange *)0xa381fb);
            piVar4 = std::max<int>(&local_108[0].left,&local_19c);
            local_1a0 = ConstantRange::upper((ConstantRange *)0xa3823e);
            piVar4 = std::min<int>(piVar4,&local_1a0);
            local_108[0].left = *piVar4;
            local_1a4 = ConstantRange::lower((ConstantRange *)0xa382a2);
            piVar4 = std::max<int>(&local_108[0].right,&local_1a4);
            local_1a8 = ConstantRange::upper((ConstantRange *)0xa382e5);
            piVar4 = std::min<int>(piVar4,&local_1a8);
            local_108[0].right = *piVar4;
          }
          bVar1 = Type::isPackedArray((Type *)0xa38339);
          if (bVar1) {
            Type::getArrayElementType(in_stack_fffffffffffffc28);
            local_1b4 = Type::getBitWidth(in_stack_fffffffffffffc28);
            iVar2 = ConstantRange::translateIndex
                              ((ConstantRange *)in_stack_fffffffffffffc28,
                               (int32_t)((ulong)in_stack_fffffffffffffc20 >> 0x20));
            local_108[0].left = iVar2 * local_1b4 + -1 + local_1b4;
            iVar2 = ConstantRange::translateIndex
                              ((ConstantRange *)in_stack_fffffffffffffc28,
                               (int32_t)((ulong)in_stack_fffffffffffffc20 >> 0x20));
            local_108[0].right = iVar2 * local_1b4;
            std::optional<slang::ConstantRange>::optional<slang::ConstantRange,_true>
                      ((optional<slang::ConstantRange> *)in_stack_fffffffffffffc20,
                       (ConstantRange *)in_stack_fffffffffffffc18);
          }
          else {
            bVar1 = Type::isUnpackedArray(in_stack_fffffffffffffc18);
            if (bVar1) {
              local_1b0 = ConstantRange::reverse((ConstantRange *)in_stack_fffffffffffffc18);
              local_174 = local_1b0;
            }
            iVar2 = ConstantRange::translateIndex
                              ((ConstantRange *)in_stack_fffffffffffffc28,
                               (int32_t)((ulong)in_stack_fffffffffffffc20 >> 0x20));
            local_108[0].left = iVar2;
            iVar2 = ConstantRange::translateIndex
                              ((ConstantRange *)in_stack_fffffffffffffc28,
                               (int32_t)((ulong)in_stack_fffffffffffffc20 >> 0x20));
            local_108[0].right = iVar2;
            std::optional<slang::ConstantRange>::optional<slang::ConstantRange,_true>
                      ((optional<slang::ConstantRange> *)in_stack_fffffffffffffc20,
                       (ConstantRange *)in_stack_fffffffffffffc18);
          }
        }
        else {
          bVar1 = slang::ConstantValue::bad((ConstantValue *)0xa384e1);
          uVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc78);
          if (bVar1) {
            if ((local_108[0].left < 0) || ((long)local_108[0] < 0)) {
              local_204 = 0xd00007;
              local_218 = (in_RDI->super_Expression).sourceRange.startLoc;
              SStack_210 = (in_RDI->super_Expression).sourceRange.endLoc;
              range_06.endLoc._0_4_ = uVar8;
              range_06.startLoc = (SourceLocation)in_stack_fffffffffffffc70;
              range_06.endLoc._4_4_ = in_stack_fffffffffffffc7c;
              local_200 = EvalContext::addDiag
                                    (in_stack_fffffffffffffc68,in_stack_fffffffffffffc84,range_06);
              arg_00 = (int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
              pDVar6 = Diagnostic::operator<<<int>((Diagnostic *)in_stack_fffffffffffffc30,arg_00);
              Diagnostic::operator<<<int>(pDVar6,arg_00);
              ast::operator<<(in_stack_fffffffffffffc70,(Type *)in_stack_fffffffffffffc68);
              if ((local_29 & 1) != 0) {
                local_220[1] = 0;
                piVar4 = std::max<int>(&local_108[0].left,local_220 + 1);
                local_108[0].left = *piVar4;
                local_220[0] = 0;
                in_stack_fffffffffffffc20 =
                     (EvalContext *)std::max<int>(&local_108[0].right,local_220);
                local_108[0].right = *(int32_t *)&(in_stack_fffffffffffffc20->astCtx).scope.ptr;
              }
            }
          }
          else {
            pDVar6 = (Diagnostic *)
                     slang::ConstantValue::size((ConstantValue *)in_stack_fffffffffffffc20);
            local_1c0 = pDVar6;
            if ((((local_108[0].left < 0) || ((long)local_108[0] < 0)) ||
                (pDVar6 <= (Diagnostic *)(long)local_108[0].left)) ||
               (pDVar6 <= (Diagnostic *)(long)local_108[0].right)) {
              local_1cc = 0x24000c;
              local_1e8 = (in_RDI->super_Expression).sourceRange.startLoc;
              SStack_1e0 = (in_RDI->super_Expression).sourceRange.endLoc;
              range_05.endLoc._0_4_ = uVar8;
              range_05.startLoc = (SourceLocation)pDVar6;
              range_05.endLoc._4_4_ = in_stack_fffffffffffffc7c;
              arg = EvalContext::addDiag
                              (in_stack_fffffffffffffc68,in_stack_fffffffffffffc84,range_05);
              local_1c8 = arg;
              Diagnostic::operator<<<int>
                        ((Diagnostic *)in_stack_fffffffffffffc30,
                         (int)((ulong)in_stack_fffffffffffffc28 >> 0x20));
              Diagnostic::operator<<<int>
                        ((Diagnostic *)in_stack_fffffffffffffc30,
                         (int)((ulong)in_stack_fffffffffffffc28 >> 0x20));
              ast::operator<<(pDVar6,(Type *)arg);
              Diagnostic::operator<<<unsigned_long>
                        ((Diagnostic *)in_stack_fffffffffffffc30,
                         (unsigned_long)in_stack_fffffffffffffc28);
            }
            if ((local_29 & 1) != 0) {
              local_1ec = 0;
              piVar4 = std::max<int>(&local_108[0].left,&local_1ec);
              local_1f8[2] = (int)local_1c0;
              piVar4 = std::min<int>(piVar4,local_1f8 + 2);
              local_108[0].left = *piVar4;
              local_1f8[1] = 0;
              piVar4 = std::max<int>(&local_108[0].right,local_1f8 + 1);
              local_1f8[0] = (int)local_1c0;
              piVar4 = std::min<int>(piVar4,local_1f8);
              local_108[0].right = *piVar4;
            }
          }
          std::optional<slang::ConstantRange>::optional<slang::ConstantRange,_true>
                    ((optional<slang::ConstantRange> *)in_stack_fffffffffffffc20,
                     (ConstantRange *)in_stack_fffffffffffffc18);
        }
      }
      else {
        local_e0 = 0x5c0007;
        pEVar3 = right(in_RDI);
        local_f8 = (pEVar3->sourceRange).startLoc;
        SStack_f0 = (pEVar3->sourceRange).endLoc;
        range_02.endLoc._0_4_ = in_stack_fffffffffffffc78;
        range_02.startLoc = (SourceLocation)in_stack_fffffffffffffc70;
        range_02.endLoc._4_4_ = in_stack_fffffffffffffc7c;
        EvalContext::addDiag(in_stack_fffffffffffffc68,in_stack_fffffffffffffc84,range_02);
        Diagnostic::operator<<
                  ((Diagnostic *)in_stack_fffffffffffffc20,
                   (ConstantValue *)in_stack_fffffffffffffc18);
        ast::operator<<(in_stack_fffffffffffffc70,(Type *)in_stack_fffffffffffffc68);
        std::optional<slang::ConstantRange>::optional((optional<slang::ConstantRange> *)&local_c);
      }
    }
    else {
      local_bc = 0x5c0007;
      pEVar3 = left(in_RDI);
      local_d8 = (pEVar3->sourceRange).startLoc;
      SStack_d0 = (pEVar3->sourceRange).endLoc;
      range_01.endLoc._0_4_ = in_stack_fffffffffffffc78;
      range_01.startLoc = (SourceLocation)in_stack_fffffffffffffc70;
      range_01.endLoc._4_4_ = in_stack_fffffffffffffc7c;
      EvalContext::addDiag(in_stack_fffffffffffffc68,in_stack_fffffffffffffc84,range_01);
      Diagnostic::operator<<
                ((Diagnostic *)in_stack_fffffffffffffc20,(ConstantValue *)in_stack_fffffffffffffc18)
      ;
      ast::operator<<(in_stack_fffffffffffffc70,(Type *)in_stack_fffffffffffffc68);
      std::optional<slang::ConstantRange>::optional((optional<slang::ConstantRange> *)&local_c);
    }
  }
  else {
    std::optional<slang::ConstantRange>::optional((optional<slang::ConstantRange> *)&local_c);
  }
LAB_00a3881e:
  local_9c = 1;
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xa3882b);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xa38838);
  oVar7.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ConstantRange>._8_4_ =
       (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),local_4);
  oVar7.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ConstantRange>._M_payload = local_c;
  return (optional<slang::ConstantRange>)
         oVar7.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ConstantRange>;
}

Assistant:

std::optional<ConstantRange> RangeSelectExpression::evalRange(EvalContext& context,
                                                              const ConstantValue& val,
                                                              bool enforceBounds) const {
    auto prevQ = context.getQueueTarget();
    if (val.isQueue())
        context.setQueueTarget(&val);

    ConstantValue cl = left().eval(context);
    ConstantValue cr = right().eval(context);

    context.setQueueTarget(prevQ);
    if (!cl || !cr)
        return std::nullopt;

    const Type& valueType = *value().type;
    std::optional<int32_t> li = cl.integer().as<int32_t>();
    std::optional<int32_t> ri = cr.integer().as<int32_t>();
    if (!li) {
        context.addDiag(diag::IndexValueInvalid, left().sourceRange) << cl << valueType;
        return std::nullopt;
    }
    if (!ri) {
        context.addDiag(diag::IndexValueInvalid, right().sourceRange) << cr << valueType;
        return std::nullopt;
    }

    ConstantRange result;
    if (selectionKind == RangeSelectionKind::Simple) {
        result = {*li, *ri};
        if (checkRangeOverflow(result, context, sourceRange))
            return std::nullopt;
    }
    else {
        bool isLittleEndian = false;
        if (valueType.hasFixedRange())
            isLittleEndian = valueType.getFixedRange().isLittleEndian();

        auto range = ConstantRange::getIndexedRange(*li, *ri, isLittleEndian,
                                                    selectionKind == RangeSelectionKind::IndexedUp);
        if (!range) {
            context.addDiag(diag::RangeWidthOverflow, sourceRange);
            return std::nullopt;
        }

        result = *range;
    }

    if (valueType.hasFixedRange()) {
        ConstantRange valueRange = valueType.getFixedRange();
        if (!warnedAboutRange &&
            (!valueRange.containsPoint(result.left) || !valueRange.containsPoint(result.right))) {
            auto& diag = context.addDiag(diag::RangeOOB, sourceRange);
            diag << result.left << result.right;
            diag << valueType;
        }

        if (enforceBounds) {
            result.left = std::min(std::max(result.left, valueRange.lower()), valueRange.upper());
            result.right = std::min(std::max(result.right, valueRange.lower()), valueRange.upper());
        }

        if (!valueType.isPackedArray()) {
            if (valueType.isUnpackedArray()) {
                // Unpacked arrays are stored reversed in memory, so reverse the range here.
                valueRange = valueRange.reverse();
            }
            result.left = valueRange.translateIndex(result.left);
            result.right = valueRange.translateIndex(result.right);
            return result;
        }

        // For packed arrays we're potentially selecting multi-bit elements.
        int32_t width = (int32_t)valueType.getArrayElementType()->getBitWidth();
        result.left = valueRange.translateIndex(result.left) * width + width - 1;
        result.right = valueRange.translateIndex(result.right) * width;

        return result;
    }

    // Out of bounds ranges are allowed, we just issue a warning.
    if (!val.bad()) {
        size_t size = val.size();
        if (result.left < 0 || result.right < 0 || size_t(result.left) >= size ||
            size_t(result.right) >= size) {

            auto& diag = context.addDiag(diag::ConstEvalDynamicArrayRange, sourceRange);
            diag << result.left << result.right;
            diag << valueType;
            diag << size;
        }

        if (enforceBounds) {
            result.left = std::min(std::max(result.left, 0), int32_t(size));
            result.right = std::min(std::max(result.right, 0), int32_t(size));
        }
    }
    else if (result.left < 0 || result.right < 0) {
        auto& diag = context.addDiag(diag::RangeOOB, sourceRange);
        diag << result.left << result.right;
        diag << valueType;

        if (enforceBounds) {
            result.left = std::max(result.left, 0);
            result.right = std::max(result.right, 0);
        }
    }

    return result;
}